

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_WolfAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  PClassActor *this;
  BYTE *pBVar2;
  double dVar3;
  double dVar4;
  PClass *pPVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  VMValue *pVVar11;
  PClassActor *pPVar12;
  VMValue *pVVar13;
  AActor *pAVar14;
  int iVar15;
  AActor *t1;
  uint uVar16;
  char *pcVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  bool bVar21;
  void *pvVar22;
  double dVar23;
  double dVar24;
  DAngle angle;
  DAngle local_a0;
  FSoundID local_98;
  FName local_94;
  DVector3 BloodPos;
  DAngle local_68;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DVector2 vec;
  PClass *pPVar10;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar17 = "(paramnum) < numparam";
    goto LAB_003dd565;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dd536:
    pcVar17 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dd565:
    __assert_fail(pcVar17,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x14be,
                  "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  t1 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_003dcef4;
    pPVar10 = (t1->super_DThinker).super_DObject.Class;
    if (pPVar10 == (PClass *)0x0) {
      iVar6 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
      pPVar10 = (PClass *)CONCAT44(extraout_var,iVar6);
      (t1->super_DThinker).super_DObject.Class = pPVar10;
    }
    bVar21 = pPVar10 != (PClass *)0x0;
    if (pPVar10 != pPVar5 && bVar21) {
      do {
        pPVar10 = pPVar10->ParentClass;
        bVar21 = pPVar10 != (PClass *)0x0;
        if (pPVar10 == pPVar5) break;
      } while (pPVar10 != (PClass *)0x0);
    }
    if (!bVar21) {
      pcVar17 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dd565;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_003dd536;
LAB_003dcef4:
    t1 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[1].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd650:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14bf,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar16 = pVVar11[1].field_0.i;
LAB_003dcf44:
    if (pVVar11[2].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd66f:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c0,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = pVVar11[2].field_0.i;
LAB_003dcf51:
    if (pVVar11[3].field_0.field_3.Type != '\x01') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dd61f:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c1,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar22 = pVVar11[3].field_0.field_1.a;
LAB_003dcf60:
    if (pVVar11[4].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd600:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c2,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar15 = pVVar11[4].field_0.i;
LAB_003dcf6e:
    if (pVVar11[5].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd5e1:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c3,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar9 = pVVar11[5].field_0.i;
LAB_003dcf7b:
    if (pVVar11[6].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd5c2:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c4,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar18 = pVVar11[6].field_0.i;
LAB_003dcf89:
    if (pVVar11[7].field_0.field_3.Type != '\0') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dd5a3:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c5,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar20 = pVVar11[7].field_0.i;
LAB_003dcf97:
    if (pVVar11[8].field_0.field_3.Type != '\x01') {
      pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dd584:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c6,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar23 = pVVar11[8].field_0.f;
LAB_003dcfac:
    if ((pVVar11[9].field_0.field_3.Type != '\x03') ||
       ((pVVar13 = pVVar11 + 9, pVVar11[9].field_0.field_1.atag != 1 &&
        ((pVVar13->field_0).field_1.a != (void *)0x0)))) {
      pcVar17 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003dd546:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14c7,
                    "int AF_AActor_A_WolfAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd650;
    }
    uVar16 = param[1].field_0.i;
    if (numparam < 3) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf44;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd66f;
    }
    iVar6 = param[2].field_0.i;
    if (numparam == 3) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf51;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dd61f;
    }
    pvVar22 = (void *)param[3].field_0.f;
    if ((uint)numparam < 5) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf60;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd600;
    }
    iVar15 = param[4].field_0.i;
    if (numparam == 5) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf6e;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd5e1;
    }
    iVar9 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf7b;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd5c2;
    }
    iVar18 = param[6].field_0.i;
    if (numparam == 7) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf89;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar17 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dd5a3;
    }
    iVar20 = param[7].field_0.i;
    if ((uint)numparam < 9) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcf97;
    }
    if (param[8].field_0.field_3.Type != '\x01') {
      pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dd584;
    }
    dVar23 = param[8].field_0.f;
    if (numparam == 9) {
      pVVar11 = defaultparam->Array;
      goto LAB_003dcfac;
    }
    if ((param[9].field_0.field_3.Type != '\x03') ||
       ((pVVar13 = param + 9, param[9].field_0.field_1.atag != 1 &&
        ((pVVar13->field_0).field_1.a != (void *)0x0)))) {
      pcVar17 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003dd546;
    }
  }
  pAVar14 = (t1->target).field_0.p;
  if (pAVar14 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (t1->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  this = (PClassActor *)(pVVar13->field_0).field_1.a;
  bVar21 = P_CheckSight(t1,pAVar14,0);
  if (!bVar21) {
    return 0;
  }
  A_FaceTarget(t1);
  pAVar14 = (t1->target).field_0.p;
  AActor::AngleTo((AActor *)&BloodPos,pAVar14,SUB81(t1,0));
  dVar1 = (pAVar14->Angles).Yaw.Degrees;
  pAVar14 = (t1->target).field_0.p;
  if (pAVar14 == (AActor *)0x0) {
LAB_003dd0a6:
    pAVar14 = (AActor *)0x0;
  }
  else if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (t1->target).field_0.p = (AActor *)0x0;
    goto LAB_003dd0a6;
  }
  bVar21 = P_CheckSight(pAVar14,t1,0);
  pAVar14 = (t1->target).field_0.p;
  if ((pAVar14 != (AActor *)0x0) &&
     (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (t1->target).field_0.p = (AActor *)0x0;
  }
  AActor::Vec2To((AActor *)&vec,t1);
  dVar24 = ABS(vec.X);
  if (ABS(vec.X) <= ABS(vec.Y)) {
    dVar24 = ABS(vec.Y);
  }
  dVar24 = (double)pvVar22 * dVar24;
  iVar19 = ((uint)(byte)(21.333333333333332 <=
                         ABS((double)SUB84((dVar1 - BloodPos.X) * 11930464.711111112 +
                                           6755399441055744.0,0) * 8.381903171539307e-08) | ~bVar21)
            << 3 | 0xfffffff0) * (int)(dVar24 / (double)iVar9);
  pAVar14 = (t1->target).field_0.p;
  dVar1 = (pAVar14->Vel).X;
  dVar3 = (pAVar14->Vel).Y;
  dVar4 = (pAVar14->Vel).Z;
  iVar9 = iVar19 + 0x100;
  if (dVar23 <= dVar4 * dVar4 + dVar1 * dVar1 + dVar3 * dVar3) {
    iVar9 = iVar19 + 0xa0;
  }
  uVar8 = (pAVar14->flags).Value;
  uVar7 = FRandom::GenRand32(&pr_cabullet);
  if (iVar9 >> ((byte)(uVar8 >> 0x11) & 2) <= (int)(uVar7 & 0xff)) goto LAB_003dd442;
  AActor::AngleTo((AActor *)&angle,(t1->target).field_0.p,SUB81(t1,0));
  pAVar14 = (t1->target).field_0.p;
  local_50.Degrees = angle.Degrees;
  AActor::Vec3Angle(&BloodPos,pAVar14,pAVar14->radius,&local_50,pAVar14->Height * 0.5,false);
  if ((uVar16 & 1) == 0) {
    uVar8 = FRandom::GenRand32(&pr_cabullet);
    iVar15 = (int)((long)(ulong)(uVar8 & 0xff) % (long)iVar15) + 1;
  }
  iVar15 = (iVar15 >> ((double)iVar18 <= dVar24)) >> ((double)iVar20 <= dVar24);
  pAVar14 = (t1->target).field_0.p;
  bVar21 = true;
  if (((pAVar14->flags).Value & 0x80000) == 0) {
    bVar21 = ((pAVar14->flags2).Value & 0x18000000) != 0;
  }
  if (((uVar16 & 2) == 0) || (this == (PClassActor *)0x0)) {
    iVar15 = iVar15 >> ((byte)(pAVar14->flags3).Value >> 2 & 2);
    bVar21 = (bool)(bVar21 ^ 1);
    iVar9 = 0;
  }
  else {
    pPVar12 = PClassActor::GetReplacement(this,true);
    pBVar2 = (pPVar12->super_PClass).Defaults;
    if (((pBVar2[0x1c1] & 0x40) != 0) && (((((t1->target).field_0.p)->flags3).Value & 8) != 0)) {
      iVar15 = 0;
    }
    iVar9 = *(int *)(pBVar2 + 0x404);
    bVar21 = !bVar21;
    if (!bVar21) {
      local_58.Degrees = angle.Degrees;
      local_60.Degrees = angle.Degrees;
      P_SpawnPuff(t1,this,&BloodPos,&local_58,&local_60,0,0,(AActor *)0x0);
    }
  }
  if (iVar15 == 0) goto LAB_003dd442;
  pAVar14 = (t1->target).field_0.p;
  if (pAVar14 == (AActor *)0x0) {
LAB_003dd39d:
    pAVar14 = (AActor *)0x0;
  }
  else if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (t1->target).field_0.p = (AActor *)0x0;
    goto LAB_003dd39d;
  }
  local_68.Degrees = 0.0;
  local_94.Index = iVar9;
  iVar9 = P_DamageMobj(pAVar14,t1,t1,iVar15,&local_94,4,&local_68);
  if (!bVar21) goto LAB_003dd442;
  local_a0.Degrees = angle.Degrees;
  if (0 < iVar9) {
    iVar15 = iVar9;
  }
  pAVar14 = (t1->target).field_0.p;
  if (pAVar14 == (AActor *)0x0) {
LAB_003dd404:
    pAVar14 = (AActor *)0x0;
  }
  else if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (t1->target).field_0.p = (AActor *)0x0;
    goto LAB_003dd404;
  }
  P_SpawnBlood(&BloodPos,&local_a0,iVar15,pAVar14);
  pAVar14 = (t1->target).field_0.p;
  if (pAVar14 == (AActor *)0x0) {
LAB_003dd435:
    pAVar14 = (AActor *)0x0;
  }
  else if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (t1->target).field_0.p = (AActor *)0x0;
    goto LAB_003dd435;
  }
  P_TraceBleed(iVar15,pAVar14,t1);
LAB_003dd442:
  local_98.ID = iVar6;
  S_Sound(t1,1,&local_98,1.0,1.0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WolfAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)				
	PARAM_SOUND_DEF	(sound)				
	PARAM_FLOAT_DEF	(snipe)				
	PARAM_INT_DEF	(maxdamage)			
	PARAM_INT_DEF	(blocksize)			
	PARAM_INT_DEF	(pointblank)		
	PARAM_INT_DEF	(longrange)			
	PARAM_FLOAT_DEF	(runspeed)			
	PARAM_CLASS_DEF	(pufftype, AActor)	

	if (!self->target)
		return 0;

	// Enemy can't see target
	if (!P_CheckSight(self, self->target))
		return 0;

	A_FaceTarget (self);

	// Target can dodge if it can see enemy
	DAngle angle = absangle(self->target->Angles.Yaw, self->target->AngleTo(self));
	bool dodge = (P_CheckSight(self->target, self) && angle < 30. * 256. / 360.);	// 30 byteangles ~ 21�

	// Distance check is simplistic
	DVector2 vec = self->Vec2To(self->target);
	double dx = fabs (vec.X);
	double dy = fabs (vec.Y);
	double dist = dx > dy ? dx : dy;

	// Some enemies are more precise
	dist *= snipe;

	// Convert distance into integer number of blocks
	int idist = int(dist / blocksize);

	// Now for the speed accuracy thingie
	double speed = self->target->Vel.LengthSquared();
	int hitchance = speed < runspeed ? 256 : 160;

	// Distance accuracy (factoring dodge)
	hitchance -= idist * (dodge ? 16 : 8);

	// While we're here, we may as well do something for this:
	if (self->target->flags & MF_SHADOW)
	{
		hitchance >>= 2;
	}

	// The attack itself
	if (pr_cabullet() < hitchance)
	{
		// Compute position for spawning blood/puff
		DAngle angle = self->target->AngleTo(self);
		DVector3 BloodPos = self->target->Vec3Angle(self->target->radius, angle, self->target->Height/2);

		int damage = flags & WAF_NORANDOM ? maxdamage : (1 + (pr_cabullet() % maxdamage));
		if (dist >= pointblank)
			damage >>= 1;
		if (dist >= longrange)
			damage >>= 1;
		FName mod = NAME_None;
		bool spawnblood = !((self->target->flags & MF_NOBLOOD) 
			|| (self->target->flags2 & (MF2_INVULNERABLE|MF2_DORMANT)));
		if (flags & WAF_USEPUFF && pufftype)
		{
			AActor *dpuff = GetDefaultByType(pufftype->GetReplacement());
			mod = dpuff->DamageType;

			if (dpuff->flags2 & MF2_THRUGHOST && self->target->flags3 & MF3_GHOST)
				damage = 0;
			
			if ((0 && dpuff->flags3 & MF3_PUFFONACTORS) || !spawnblood)
			{
				spawnblood = false;
				P_SpawnPuff(self, pufftype, BloodPos, angle, angle, 0);
			}
		}
		else if (self->target->flags3 & MF3_GHOST)
			damage >>= 2;
		if (damage)
		{
			int newdam = P_DamageMobj(self->target, self, self, damage, mod, DMG_THRUSTLESS);
			if (spawnblood)
			{
				P_SpawnBlood(BloodPos, angle, newdam > 0 ? newdam : damage, self->target);
				P_TraceBleed(newdam > 0 ? newdam : damage, self->target, self);
			}
		}
	}

	// And finally, let's play the sound
	S_Sound (self, CHAN_WEAPON, sound, 1, ATTN_NORM);
	return 0;
}